

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::tryEmplace_impl<QByteArray_const&>
          (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *this,QByteArray *key)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  size_t bucket_00;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *pDVar3;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *in_RSI;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> detachGuard;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
  *in_stack_ffffffffffffff28;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
  *in_stack_ffffffffffffff30;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
  *in_stack_ffffffffffffff38;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar4;
  Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *key_00;
  Bucket local_30;
  Bucket local_20;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  if (*(long *)in_RSI == 0) {
    QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::detach
              ((QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)in_stack_ffffffffffffff30
              );
  }
  local_10.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::QHash(&local_10);
  QHashPrivate::calculateHash<QByteArray>
            ((QByteArray *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  local_20.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::
             Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
             findBucketWithHash<QByteArray>(in_RSI,(QByteArray *)key_00,(size_t)in_RDI);
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
          ::Bucket::isUnused((Bucket *)0x3d680b);
  bVar2 = QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::isDetached
                    ((QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)
                     in_stack_ffffffffffffff30);
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::
                         Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
                         ::shouldGrow(*(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
                                        **)in_RSI), bVar2)))) {
    QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::operator=
              (in_stack_ffffffffffffff40,
               (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)in_stack_ffffffffffffff38
              );
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::
              Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
              shouldGrow(*(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
                           **)in_RSI);
    }
    uVar4 = bVar2;
    bucket_00 = QHashPrivate::
                Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::Bucket
                ::toBucketIndex(&local_20,
                                *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
                                  **)in_RSI);
    if (bVar2 == false) {
      in_stack_ffffffffffffff38 =
           QHashPrivate::
           Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::detached
                     (in_RDI);
      pDVar3 = in_stack_ffffffffffffff38;
    }
    else {
      pDVar3 = QHashPrivate::
               Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
               detached(in_RDI,CONCAT17(uVar4,in_stack_ffffffffffffff50));
    }
    *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> **)in_RSI =
         pDVar3;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
      Bucket::Bucket(&local_30,
                     *(Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
                       **)in_RSI,bucket_00);
    }
    else {
      local_30 = QHashPrivate::
                 Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
                 findBucketWithHash<QByteArray>(in_RSI,(QByteArray *)key_00,(size_t)in_RDI);
    }
    local_20 = local_30;
  }
  if (bVar1) {
    in_stack_ffffffffffffff30 =
         (Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *)
         QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>
         ::Bucket::insert((Bucket *)0x3d699c);
    QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::createInPlace<>
              ((Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)in_stack_ffffffffffffff30,
               (QByteArray *)in_stack_ffffffffffffff28);
    *(long *)(*(long *)in_RSI + 8) = *(long *)(*(long *)in_RSI + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::Bucket
  ::toIterator((Bucket *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  it.bucket = (size_t)in_stack_ffffffffffffff38;
  it.d = in_stack_ffffffffffffff30;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::iterator::iterator
            ((iterator *)in_stack_ffffffffffffff28,it);
  it_00.i.bucket = (size_t)in_stack_ffffffffffffff38;
  it_00.i.d = in_stack_ffffffffffffff30;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff28,it_00,false);
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::~QHash
            ((QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (TryEmplaceResult *)key_00;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }